

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QColorLineEdit.cpp
# Opt level: O0

void QColorLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  ActionPosition *pAVar2;
  ActionPosition AVar3;
  ColorDialogOptions CVar4;
  QColorLineEdit *this;
  long *in_RCX;
  uint in_EDX;
  int in_ESI;
  QColorLineEdit *in_RDI;
  QColor QVar5;
  void *_v_1;
  QColorLineEdit *_t_2;
  void *_v;
  QColorLineEdit *_t_1;
  int *result;
  QColorLineEdit *_t;
  undefined4 in_stack_ffffffffffffff58;
  ActionPosition in_stack_ffffffffffffff5c;
  QColorLineEdit *in_stack_ffffffffffffff60;
  QColorLineEdit *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff74;
  undefined8 local_58;
  ActionPosition local_50;
  undefined2 uStack_4c;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      embededActionPositionChanged
                ((QColorLineEdit *)((ulong)in_stack_ffffffffffffff74 << 0x20),
                 (ActionPosition)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    }
    else if (in_EDX == 1) {
      colorChanged((QColorLineEdit *)CONCAT44(in_stack_ffffffffffffff74,1),
                   (QColor *)in_stack_ffffffffffffff68);
    }
  }
  else if (in_ESI == 5) {
    pcVar1 = *(code **)in_RCX[1];
    if (pcVar1 == embededActionPositionChanged &&
        (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
      *(undefined4 *)*in_RCX = 0;
    }
    else {
      pcVar1 = *(code **)in_RCX[1];
      if (pcVar1 == colorChanged && (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
        *(undefined4 *)*in_RCX = 1;
      }
    }
  }
  else if (in_ESI == 1) {
    pAVar2 = (ActionPosition *)*in_RCX;
    switch(in_EDX) {
    case 0:
      AVar3 = embededActionPosition(in_RDI);
      *pAVar2 = AVar3;
      break;
    case 1:
      QVar5 = color(in_stack_ffffffffffffff60);
      local_58 = QVar5._0_8_;
      local_50 = QVar5.ct._4_4_;
      uStack_4c = QVar5.ct._8_2_;
      *(undefined8 *)pAVar2 = local_58;
      pAVar2[2] = local_50;
      *(undefined2 *)(pAVar2 + 3) = uStack_4c;
      break;
    case 2:
      caption((QColorLineEdit *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::operator=((QString *)in_stack_ffffffffffffff60,
                         (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x1d50bb);
      break;
    case 3:
      CVar4 = options((QColorLineEdit *)
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      *pAVar2 = CVar4.i;
    }
  }
  else if (in_ESI == 2) {
    this = (QColorLineEdit *)(ulong)in_EDX;
    switch(this) {
    case (QColorLineEdit *)0x0:
      setEmbededActionPosition(this,in_stack_ffffffffffffff5c);
      break;
    case (QColorLineEdit *)0x1:
      setColor(this,(QColor *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      break;
    case (QColorLineEdit *)0x2:
      setCaption(this,(QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      break;
    case (QColorLineEdit *)0x3:
      setOptions(in_stack_ffffffffffffff68,(ColorDialogOptions)*(Int *)*in_RCX);
    }
  }
  return;
}

Assistant:

void QColorLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QColorLineEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->embededActionPositionChanged((*reinterpret_cast< std::add_pointer_t<QLineEdit::ActionPosition>>(_a[1]))); break;
        case 1: _t->colorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QColorLineEdit::*)(QLineEdit::ActionPosition );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QColorLineEdit::embededActionPositionChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QColorLineEdit::*)(const QColor & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QColorLineEdit::colorChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QColorLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QLineEdit::ActionPosition*>(_v) = _t->embededActionPosition(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 3: *reinterpret_cast< QColorAction::ColorDialogOptions*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QColorLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEmbededActionPosition(*reinterpret_cast< QLineEdit::ActionPosition*>(_v)); break;
        case 1: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        case 2: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setOptions(*reinterpret_cast< QColorAction::ColorDialogOptions*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}